

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O2

int ncnn::from_gray2rgb(uchar *gray,int w,int h,int stride,Mat *m,Allocator *allocator)

{
  long extraout_RAX;
  long lVar1;
  long lVar2;
  long lVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  int iVar8;
  void *pvVar9;
  Mat local_70;
  
  Mat::create(m,w,h,3,4,allocator);
  pvVar7 = m->data;
  lVar1 = extraout_RAX;
  if ((pvVar7 != (void *)0x0) && (lVar1 = (long)m->c * m->cstep, lVar1 != 0)) {
    iVar5 = 0;
    iVar6 = 0;
    if (0 < h) {
      iVar6 = h;
    }
    iVar8 = stride - w;
    if (iVar8 != 0) {
      h = 1;
    }
    local_70.w = m->w;
    local_70.h = m->h;
    local_70.elemsize = m->elemsize;
    local_70.elempack = m->elempack;
    local_70.allocator = m->allocator;
    if (iVar8 == 0) {
      iVar6 = 1;
    }
    local_70.dims = 2;
    local_70.c = 1;
    local_70.refcount = (int *)0x0;
    local_70.cstep = (size_t)(local_70.h * local_70.w);
    local_70.data = pvVar7;
    Mat::~Mat(&local_70);
    Mat::channel(&local_70,m,1);
    pvVar9 = local_70.data;
    Mat::~Mat(&local_70);
    Mat::channel(&local_70,m,2);
    pvVar4 = local_70.data;
    Mat::~Mat(&local_70);
    lVar1 = (long)iVar8;
    for (; iVar5 != iVar6; iVar5 = iVar5 + 1) {
      lVar2 = 0;
      lVar3 = 0;
      for (iVar8 = h * w; 0 < iVar8; iVar8 = iVar8 + -1) {
        *(float *)((long)pvVar7 + lVar3 * 4) = (float)gray[lVar3];
        *(float *)((long)pvVar9 + lVar3 * 4) = (float)gray[lVar3];
        *(float *)((long)pvVar4 + lVar3 * 4) = (float)gray[lVar3];
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + -4;
      }
      gray = gray + lVar3 + lVar1;
      pvVar7 = (void *)((long)pvVar7 - lVar2);
      pvVar9 = (void *)((long)pvVar9 - lVar2);
      pvVar4 = (void *)((long)pvVar4 - lVar2);
    }
  }
  return (int)lVar1;
}

Assistant:

static int from_gray2rgb(const unsigned char* gray, int w, int h, int stride, Mat& m, Allocator* allocator)
{
    m.create(w, h, 3, 4u, allocator);
    if (m.empty())
        return -100;

    const int wgap = stride - w;
    if (wgap == 0)
    {
        w = w * h;
        h = 1;
    }

    float* ptr0 = m.channel(0);
    float* ptr1 = m.channel(1);
    float* ptr2 = m.channel(2);

    for (int y=0; y<h; y++)
    {
#if __ARM_NEON
        int nn = w >> 4;
        int remain = w - (nn << 4);
#else
        int remain = w;
#endif // __ARM_NEON

#if __ARM_NEON
#if __aarch64__
        for (; nn>0; nn--)
        {
            uint8x16_t _gray = vld1q_u8(gray);
            uint16x8_t _gray16_0 = vmovl_u8(vget_low_u8(_gray));
            uint16x8_t _gray16_1 = vmovl_u8(vget_high_u8(_gray));

            float32x4_t _graylow_0 = vcvtq_f32_u32(vmovl_u16(vget_low_u16(_gray16_0)));
            float32x4_t _grayhigh_0 = vcvtq_f32_u32(vmovl_u16(vget_high_u16(_gray16_0)));
            float32x4_t _graylow_1 = vcvtq_f32_u32(vmovl_u16(vget_low_u16(_gray16_1)));
            float32x4_t _grayhigh_1 = vcvtq_f32_u32(vmovl_u16(vget_high_u16(_gray16_1)));

            vst1q_f32(ptr0, _graylow_0);
            vst1q_f32(ptr0+4, _grayhigh_0);
            vst1q_f32(ptr0+8, _graylow_1);
            vst1q_f32(ptr0+12, _grayhigh_1);

            vst1q_f32(ptr1, _graylow_0);
            vst1q_f32(ptr1+4, _grayhigh_0);
            vst1q_f32(ptr1+8, _graylow_1);
            vst1q_f32(ptr1+12, _grayhigh_1);

            vst1q_f32(ptr2, _graylow_0);
            vst1q_f32(ptr2+4, _grayhigh_0);
            vst1q_f32(ptr2+8, _graylow_1);
            vst1q_f32(ptr2+12, _grayhigh_1);

            gray += 16;
            ptr0 += 16;
            ptr1 += 16;
            ptr2 += 16;
        }
#else
        if (nn > 0)
        {
        asm volatile(
            "0:                             \n"
            "pld        [%1, #128]          \n"
            "vld1.u8    {d0,d1}, [%1]!      \n"
            "vmovl.u8   q8, d0              \n"
            "vmovl.u8   q9, d1              \n"
            "vmovl.u16  q0, d16             \n"
            "vmovl.u16  q1, d17             \n"
            "vmovl.u16  q2, d18             \n"
            "vmovl.u16  q3, d19             \n"
            "vcvt.f32.u32   q0, q0          \n"
            "vcvt.f32.u32   q1, q1          \n"
            "vcvt.f32.u32   q2, q2          \n"
            "vcvt.f32.u32   q3, q3          \n"
            "subs       %0, #1              \n"
            "vst1.f32   {d0-d3}, [%2 :128]! \n"
            "vst1.f32   {d4-d7}, [%2 :128]! \n"
            "vst1.f32   {d0-d3}, [%3 :128]! \n"
            "vst1.f32   {d4-d7}, [%3 :128]! \n"
            "vst1.f32   {d0-d3}, [%4 :128]! \n"
            "vst1.f32   {d4-d7}, [%4 :128]! \n"
            "bne        0b                  \n"
            : "=r"(nn),     // %0
              "=r"(gray),   // %1
              "=r"(ptr0),   // %2
              "=r"(ptr1),   // %3
              "=r"(ptr2)    // %4
            : "0"(nn),
              "1"(gray),
              "2"(ptr0),
              "3"(ptr1),
              "4"(ptr2)
            : "cc", "memory", "q0", "q1", "q2", "q3", "q8", "q9"
        );
        }
#endif // __aarch64__
#endif // __ARM_NEON
        for (; remain>0; remain--)
        {
            *ptr0 = *gray;
            *ptr1 = *gray;
            *ptr2 = *gray;

            gray++;
            ptr0++;
            ptr1++;
            ptr2++;
        }

        gray += wgap;
    }

    return 0;
}